

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BReverbModel.cpp
# Opt level: O1

bool __thiscall MT32Emu::BReverbModelImpl<float>::isActive(BReverbModelImpl<float> *this)

{
  Bit32u BVar1;
  float *pfVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  
  iVar3 = (*(this->super_BReverbModel)._vptr_BReverbModel[2])();
  if ((char)iVar3 == '\0') {
    bVar7 = false;
  }
  else {
    uVar4 = (ulong)this->currentSettings->numberOfAllpasses;
    bVar7 = uVar4 != 0;
    if (bVar7) {
      uVar5 = 0;
      do {
        pfVar2 = (this->allpasses[uVar5]->super_RingBuffer<float>).buffer;
        if ((pfVar2 != (float *)0x0) &&
           (BVar1 = (this->allpasses[uVar5]->super_RingBuffer<float>).size, BVar1 != 0)) {
          lVar6 = 0;
          do {
            if (0.001 < ABS(pfVar2[lVar6])) {
              if (bVar7) {
                return true;
              }
              goto LAB_0011adde;
            }
            lVar6 = lVar6 + 1;
          } while (BVar1 != (Bit32u)lVar6);
        }
        uVar5 = uVar5 + 1;
        bVar7 = uVar5 < uVar4;
      } while (uVar5 != uVar4);
    }
LAB_0011adde:
    uVar4 = (ulong)this->currentSettings->numberOfCombs;
    bVar7 = uVar4 != 0;
    if (bVar7) {
      uVar5 = 0;
      do {
        pfVar2 = (this->combs[uVar5]->super_RingBuffer<float>).buffer;
        if ((pfVar2 != (float *)0x0) &&
           (BVar1 = (this->combs[uVar5]->super_RingBuffer<float>).size, BVar1 != 0)) {
          lVar6 = 0;
          do {
            if (0.001 < ABS(pfVar2[lVar6])) {
              return bVar7;
            }
            lVar6 = lVar6 + 1;
          } while (BVar1 != (Bit32u)lVar6);
        }
        uVar5 = uVar5 + 1;
        bVar7 = uVar5 < uVar4;
      } while (uVar5 != uVar4);
    }
  }
  return bVar7;
}

Assistant:

bool isActive() const {
		if (!isOpen()) return false;
		for (Bit32u i = 0; i < currentSettings.numberOfAllpasses; i++) {
			if (!allpasses[i]->isEmpty()) return true;
		}
		for (Bit32u i = 0; i < currentSettings.numberOfCombs; i++) {
			if (!combs[i]->isEmpty()) return true;
		}
		return false;
	}